

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lodepng.cpp
# Opt level: O0

void getPixelColorRGBA16(unsigned_short *r,unsigned_short *g,unsigned_short *b,unsigned_short *a,
                        uchar *in,size_t i,LodePNGColorMode *mode)

{
  unsigned_short uVar1;
  size_t i_local;
  uchar *in_local;
  unsigned_short *a_local;
  unsigned_short *b_local;
  unsigned_short *g_local;
  unsigned_short *r_local;
  
  if (mode->colortype == LCT_GREY) {
    uVar1 = (ushort)in[i * 2] * 0x100 + (ushort)in[i * 2 + 1];
    *b = uVar1;
    *g = uVar1;
    *r = uVar1;
    if ((mode->key_defined == 0) || ((uint)in[i * 2] * 0x100 + (uint)in[i * 2 + 1] != mode->key_r))
    {
      *a = 0xffff;
    }
    else {
      *a = 0;
    }
  }
  else if (mode->colortype == LCT_RGB) {
    *r = (ushort)in[i * 6] * 0x100 + (ushort)in[i * 6 + 1];
    *g = (ushort)in[i * 6 + 2] * 0x100 + (ushort)in[i * 6 + 3];
    *b = (ushort)in[i * 6 + 4] * 0x100 + (ushort)in[i * 6 + 5];
    if ((((mode->key_defined == 0) || ((uint)in[i * 6] * 0x100 + (uint)in[i * 6 + 1] != mode->key_r)
         ) || ((uint)in[i * 6 + 2] * 0x100 + (uint)in[i * 6 + 3] != mode->key_g)) ||
       ((uint)in[i * 6 + 4] * 0x100 + (uint)in[i * 6 + 5] != mode->key_b)) {
      *a = 0xffff;
    }
    else {
      *a = 0;
    }
  }
  else if (mode->colortype == LCT_GREY_ALPHA) {
    uVar1 = (ushort)in[i * 4] * 0x100 + (ushort)in[i * 4 + 1];
    *b = uVar1;
    *g = uVar1;
    *r = uVar1;
    *a = (ushort)in[i * 4 + 2] * 0x100 + (ushort)in[i * 4 + 3];
  }
  else if (mode->colortype == LCT_RGBA) {
    *r = (ushort)in[i * 8] * 0x100 + (ushort)in[i * 8 + 1];
    *g = (ushort)in[i * 8 + 2] * 0x100 + (ushort)in[i * 8 + 3];
    *b = (ushort)in[i * 8 + 4] * 0x100 + (ushort)in[i * 8 + 5];
    *a = (ushort)in[i * 8 + 6] * 0x100 + (ushort)in[i * 8 + 7];
  }
  return;
}

Assistant:

static void getPixelColorRGBA16(unsigned short* r, unsigned short* g, unsigned short* b, unsigned short* a,
                                const unsigned char* in, size_t i, const LodePNGColorMode* mode)
{
  if(mode->colortype == LCT_GREY)
  {
    *r = *g = *b = 256 * in[i * 2 + 0] + in[i * 2 + 1];
    if(mode->key_defined && 256U * in[i * 2 + 0] + in[i * 2 + 1] == mode->key_r) *a = 0;
    else *a = 65535;
  }
  else if(mode->colortype == LCT_RGB)
  {
    *r = 256u * in[i * 6 + 0] + in[i * 6 + 1];
    *g = 256u * in[i * 6 + 2] + in[i * 6 + 3];
    *b = 256u * in[i * 6 + 4] + in[i * 6 + 5];
    if(mode->key_defined
       && 256u * in[i * 6 + 0] + in[i * 6 + 1] == mode->key_r
       && 256u * in[i * 6 + 2] + in[i * 6 + 3] == mode->key_g
       && 256u * in[i * 6 + 4] + in[i * 6 + 5] == mode->key_b) *a = 0;
    else *a = 65535;
  }
  else if(mode->colortype == LCT_GREY_ALPHA)
  {
    *r = *g = *b = 256u * in[i * 4 + 0] + in[i * 4 + 1];
    *a = 256u * in[i * 4 + 2] + in[i * 4 + 3];
  }
  else if(mode->colortype == LCT_RGBA)
  {
    *r = 256u * in[i * 8 + 0] + in[i * 8 + 1];
    *g = 256u * in[i * 8 + 2] + in[i * 8 + 3];
    *b = 256u * in[i * 8 + 4] + in[i * 8 + 5];
    *a = 256u * in[i * 8 + 6] + in[i * 8 + 7];
  }
}